

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  char cVar3;
  uchar uVar4;
  undefined1 uVar5;
  short sVar6;
  ushort uVar7;
  undefined8 uVar8;
  long lVar9;
  short sVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  stbi__uint32 sVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  stbi__uint32 sVar24;
  stbi__uint32 sVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  stbi__jpeg *psVar30;
  char *pcVar31;
  long lVar32;
  stbi_uc *psVar33;
  uchar *puVar34;
  void *pvVar35;
  code *pcVar36;
  stbi__context *data_00;
  undefined8 *puVar37;
  stbi_uc *psVar38;
  ulong uVar39;
  undefined8 *puVar40;
  ulong uVar41;
  undefined1 *puVar42;
  short sVar43;
  stbi__uint16 *psVar44;
  stbi__jpeg *psVar45;
  int id;
  int iVar46;
  int iVar47;
  long lVar48;
  stbi__context *psVar49;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar50;
  stbi__result_info *ri_00;
  int iVar51;
  uint uVar52;
  stbi__uint32 *y_00;
  ulong uVar53;
  ulong uVar54;
  stbi_uc *psVar55;
  byte *pbVar56;
  stbi_uc **ppsVar57;
  stbi__uint16 *psVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  short *psVar62;
  long in_FS_OFFSET;
  bool bVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  stbi__uint16 *local_8968;
  uint local_8958;
  stbi__jpeg *local_8918;
  int local_8910;
  uint local_8900;
  uint local_88fc;
  stbi_uc *coutput [4];
  int local_88d8;
  uint local_88b8;
  short data [64];
  
  psVar38 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar30 = (stbi__jpeg *)malloc(0x4888);
  psVar30->s = s;
  psVar30->idct_block_kernel = stbi__idct_simd;
  psVar30->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar30->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar19 = stbi__decode_jpeg_header(psVar30,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar30);
  if (iVar19 != 0) {
    psVar30 = (stbi__jpeg *)malloc(0x4888);
    psVar30->s = s;
    psVar30->idct_block_kernel = stbi__idct_simd;
    psVar30->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar30->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar32 = 0x46d8; lVar32 != 0x4858; lVar32 = lVar32 + 0x60) {
        psVar38 = psVar30->huff_dc[0].fast + lVar32 + -8;
        psVar38[0] = '\0';
        psVar38[1] = '\0';
        psVar38[2] = '\0';
        psVar38[3] = '\0';
        psVar38[4] = '\0';
        psVar38[5] = '\0';
        psVar38[6] = '\0';
        psVar38[7] = '\0';
        psVar38[8] = '\0';
        psVar38[9] = '\0';
        psVar38[10] = '\0';
        psVar38[0xb] = '\0';
        psVar38[0xc] = '\0';
        psVar38[0xd] = '\0';
        psVar38[0xe] = '\0';
        psVar38[0xf] = '\0';
      }
      psVar30->restart_interval = 0;
      iVar19 = stbi__decode_jpeg_header(psVar30,0);
      if (iVar19 != 0) {
        paVar1 = psVar30->img_comp;
        bVar12 = stbi__get_marker(psVar30);
LAB_0014920a:
        if (bVar12 == 0xda) {
          iVar19 = stbi__get16be(psVar30->s);
          bVar12 = stbi__get8(psVar30->s);
          uVar59 = (uint)bVar12;
          psVar30->scan_n = (uint)bVar12;
          if (((0xfb < (byte)(bVar12 - 5)) &&
              (psVar49 = psVar30->s, (int)(uint)bVar12 <= psVar49->img_n)) &&
             (iVar19 == (uint)bVar12 * 2 + 6)) {
            lVar32 = 0;
            while( true ) {
              bVar12 = stbi__get8(psVar49);
              if ((int)uVar59 <= lVar32) break;
              bVar13 = stbi__get8(psVar30->s);
              psVar49 = psVar30->s;
              uVar59 = psVar49->img_n;
              uVar39 = 0;
              if (0 < (int)uVar59) {
                uVar39 = (ulong)uVar59;
              }
              paVar50 = paVar1;
              for (uVar54 = 0; uVar39 != uVar54; uVar54 = uVar54 + 1) {
                if (paVar50->id == (uint)bVar12) {
                  uVar39 = uVar54 & 0xffffffff;
                  break;
                }
                paVar50 = paVar50 + 1;
              }
              if ((uint)uVar39 == uVar59) goto LAB_00149e62;
              psVar30->img_comp[uVar39].hd = (uint)(bVar13 >> 4);
              if ((0x3f < bVar13) || (paVar1[uVar39].ha = bVar13 & 0xf, 3 < (bVar13 & 0xf)))
              goto LAB_00149e52;
              psVar30->order[lVar32] = (uint)uVar39;
              lVar32 = lVar32 + 1;
              uVar59 = psVar30->scan_n;
            }
            psVar30->spec_start = (uint)bVar12;
            bVar12 = stbi__get8(psVar30->s);
            psVar30->spec_end = (uint)bVar12;
            bVar12 = stbi__get8(psVar30->s);
            psVar30->succ_high = (uint)(bVar12 >> 4);
            psVar30->succ_low = bVar12 & 0xf;
            iVar19 = psVar30->spec_start;
            if (psVar30->progressive == 0) {
              if (((iVar19 == 0) && (bVar12 < 0x10)) && ((bVar12 & 0xf) == 0)) {
                psVar30->spec_end = 0x3f;
                goto LAB_0014940b;
              }
            }
            else if (((iVar19 < 0x40) && (psVar30->spec_end < 0x40)) &&
                    ((iVar19 <= psVar30->spec_end && ((bVar12 < 0xe0 && ((bVar12 & 0xf) < 0xe))))))
            {
LAB_0014940b:
              stbi__jpeg_reset(psVar30);
              if (psVar30->progressive == 0) {
                if (psVar30->scan_n == 1) {
                  iVar19 = psVar30->order[0];
                  uVar59 = psVar30->img_comp[iVar19].x + 7 >> 3;
                  iVar26 = psVar30->img_comp[iVar19].y + 7 >> 3;
                  if ((int)uVar59 < 1) {
                    uVar59 = 0;
                  }
                  iVar51 = 0;
                  if (iVar26 < 1) {
                    iVar26 = 0;
                  }
                  for (iVar46 = 0; iVar46 != iVar26; iVar46 = iVar46 + 1) {
                    for (lVar32 = 0; (ulong)uVar59 * 8 != lVar32; lVar32 = lVar32 + 8) {
                      iVar47 = stbi__jpeg_decode_block
                                         (psVar30,data,
                                          (stbi__huffman *)psVar30->huff_dc[paVar1[iVar19].hd].fast,
                                          (stbi__huffman *)psVar30->huff_ac[paVar1[iVar19].ha].fast,
                                          psVar30->fast_ac[paVar1[iVar19].ha],iVar19,
                                          psVar30->dequant[paVar1[iVar19].tq]);
                      if (iVar47 == 0) {
                        bVar63 = false;
                        goto LAB_00149ca4;
                      }
                      (*psVar30->idct_block_kernel)
                                (paVar1[iVar19].data + lVar32 + iVar51 * paVar1[iVar19].w2,
                                 paVar1[iVar19].w2,data);
                      iVar47 = psVar30->todo;
                      psVar30->todo = iVar47 + -1;
                      if (iVar47 < 2) {
                        if (psVar30->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar30);
                        }
                        if ((psVar30->marker & 0xf8) != 0xd0) goto LAB_00149ca1;
                        stbi__jpeg_reset(psVar30);
                      }
                    }
                    iVar51 = iVar51 + 8;
                  }
                }
                else {
                  for (iVar19 = 0; iVar19 < psVar30->img_mcu_y; iVar19 = iVar19 + 1) {
                    for (iVar26 = 0; iVar26 < psVar30->img_mcu_x; iVar26 = iVar26 + 1) {
                      for (lVar32 = 0; lVar32 < psVar30->scan_n; lVar32 = lVar32 + 1) {
                        iVar51 = psVar30->order[lVar32];
                        for (iVar46 = 0; iVar46 < paVar1[iVar51].v; iVar46 = iVar46 + 1) {
                          for (iVar47 = 0; iVar21 = paVar1[iVar51].h, iVar47 < iVar21;
                              iVar47 = iVar47 + 1) {
                            iVar22 = paVar1[iVar51].v;
                            iVar23 = stbi__jpeg_decode_block
                                               (psVar30,data,
                                                (stbi__huffman *)
                                                psVar30->huff_dc[paVar1[iVar51].hd].fast,
                                                (stbi__huffman *)
                                                psVar30->huff_ac[paVar1[iVar51].ha].fast,
                                                psVar30->fast_ac[paVar1[iVar51].ha],iVar51,
                                                psVar30->dequant[paVar1[iVar51].tq]);
                            if (iVar23 == 0) {
                              bVar63 = false;
                              goto LAB_00149ca4;
                            }
                            (*psVar30->idct_block_kernel)
                                      (paVar1[iVar51].data +
                                       (long)((iVar21 * iVar26 + iVar47) * 8) +
                                       (long)((iVar22 * iVar19 + iVar46) * paVar1[iVar51].w2 * 8),
                                       paVar1[iVar51].w2,data);
                          }
                        }
                      }
                      iVar51 = psVar30->todo;
                      psVar30->todo = iVar51 + -1;
                      if (iVar51 < 2) {
                        if (psVar30->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar30);
                        }
                        if ((psVar30->marker & 0xf8) != 0xd0) goto LAB_00149ca1;
                        stbi__jpeg_reset(psVar30);
                      }
                    }
                  }
                }
LAB_00149ca1:
                bVar63 = true;
LAB_00149ca4:
                if (!bVar63) goto LAB_00149e62;
              }
              else if (psVar30->scan_n == 1) {
                iVar19 = psVar30->order[0];
                iVar26 = psVar30->img_comp[iVar19].x + 7 >> 3;
                iVar51 = psVar30->img_comp[iVar19].y + 7 >> 3;
                iVar46 = 0;
                if (iVar26 < 1) {
                  iVar26 = 0;
                }
                if (iVar51 < 1) {
                  iVar51 = iVar46;
                }
                for (; iVar46 != iVar51; iVar46 = iVar46 + 1) {
                  for (iVar47 = 0; iVar47 != iVar26; iVar47 = iVar47 + 1) {
                    psVar62 = paVar1[iVar19].coeff +
                              (paVar1[iVar19].coeff_w * iVar46 + iVar47) * 0x40;
                    uVar39 = (ulong)psVar30->spec_start;
                    if (uVar39 == 0) {
                      iVar21 = stbi__jpeg_decode_block_prog_dc
                                         (psVar30,psVar62,
                                          (stbi__huffman *)psVar30->huff_dc[paVar1[iVar19].hd].fast,
                                          iVar19);
                      if (iVar21 == 0) goto LAB_00149e62;
                    }
                    else {
                      iVar21 = paVar1[iVar19].ha;
                      psVar38 = psVar30->huff_ac[iVar21].fast;
                      iVar22 = psVar30->eob_run;
                      bVar12 = (byte)psVar30->succ_low;
                      if (psVar30->succ_high == 0) {
                        if (iVar22 == 0) {
                          do {
                            if (psVar30->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar30);
                            }
                            sVar43 = psVar30->fast_ac[iVar21][psVar30->code_buffer >> 0x17];
                            uVar59 = (uint)sVar43;
                            iVar22 = (int)uVar39;
                            if (sVar43 == 0) {
                              uVar59 = stbi__jpeg_huff_decode(psVar30,(stbi__huffman *)psVar38);
                              if ((int)uVar59 < 0) goto LAB_00149e52;
                              uVar52 = uVar59 >> 4;
                              if ((uVar59 & 0xf) == 0) {
                                if (uVar59 < 0xf0) {
                                  iVar22 = 1 << ((byte)uVar52 & 0x1f);
                                  psVar30->eob_run = iVar22;
                                  if (0xf < uVar59) {
                                    iVar22 = stbi__jpeg_get_bits(psVar30,uVar52);
                                    iVar22 = iVar22 + psVar30->eob_run;
                                  }
                                  goto LAB_001495bb;
                                }
                                uVar39 = (ulong)(iVar22 + 0x10);
                              }
                              else {
                                lVar32 = (ulong)uVar52 + (long)iVar22;
                                uVar39 = (ulong)((int)lVar32 + 1);
                                bVar13 = ""[lVar32];
                                iVar22 = stbi__extend_receive(psVar30,uVar59 & 0xf);
                                psVar62[bVar13] = (short)(iVar22 << (bVar12 & 0x1f));
                              }
                            }
                            else {
                              lVar32 = (ulong)(uVar59 >> 4 & 0xf) + (long)iVar22;
                              psVar30->code_buffer = psVar30->code_buffer << (sbyte)(uVar59 & 0xf);
                              psVar30->code_bits = psVar30->code_bits - (uVar59 & 0xf);
                              uVar39 = (ulong)((int)lVar32 + 1);
                              psVar62[""[lVar32]] = (short)((uVar59 >> 8) << (bVar12 & 0x1f));
                            }
                          } while ((int)uVar39 <= psVar30->spec_end);
                        }
                        else {
LAB_001495bb:
                          psVar30->eob_run = iVar22 + -1;
                        }
                      }
                      else if (iVar22 == 0) {
                        iVar21 = 0x10000 << (bVar12 & 0x1f);
                        do {
                          uVar59 = stbi__jpeg_huff_decode(psVar30,(stbi__huffman *)psVar38);
                          if ((int)uVar59 < 0) goto LAB_00149e52;
                          uVar52 = uVar59 >> 4;
                          if ((uVar59 & 0xf) == 1) {
                            iVar22 = stbi__jpeg_get_bit(psVar30);
                            iVar23 = 1;
                            if (iVar22 == 0) {
                              iVar23 = 0xffff;
                            }
                            sVar43 = (short)(iVar23 << (bVar12 & 0x1f));
                          }
                          else {
                            if ((uVar59 & 0xf) != 0) goto LAB_00149e52;
                            if (uVar59 < 0xf0) {
                              psVar30->eob_run = ~(-1 << ((byte)uVar52 & 0x1f));
                              if (0xf < uVar59) {
                                iVar22 = stbi__jpeg_get_bits(psVar30,uVar52);
                                psVar30->eob_run = psVar30->eob_run + iVar22;
                              }
                              uVar52 = 0x40;
                            }
                            else {
                              uVar52 = 0xf;
                            }
                            sVar43 = 0;
                          }
                          uVar54 = (long)(int)uVar39;
                          do {
                            while( true ) {
                              uVar39 = uVar54;
                              iVar22 = psVar30->spec_end;
                              if ((long)iVar22 < (long)uVar39) goto LAB_001496e7;
                              bVar13 = ""[uVar39];
                              if (psVar62[bVar13] == 0) break;
                              iVar22 = stbi__jpeg_get_bit(psVar30);
                              if ((iVar22 != 0) &&
                                 (sVar6 = psVar62[bVar13], (iVar21 >> 0x10 & (int)sVar6) == 0)) {
                                sVar10 = (short)((uint)iVar21 >> 0x10);
                                if (sVar6 < 1) {
                                  sVar10 = -sVar10;
                                }
                                psVar62[bVar13] = sVar6 + sVar10;
                              }
                              uVar54 = uVar39 + 1;
                            }
                            bVar63 = uVar52 != 0;
                            uVar52 = uVar52 - 1;
                            uVar54 = uVar39 + 1;
                          } while (bVar63);
                          psVar62[bVar13] = sVar43;
                          uVar39 = uVar39 + 1;
LAB_001496e7:
                        } while ((int)uVar39 <= iVar22);
                      }
                      else {
                        psVar30->eob_run = iVar22 + -1;
                        uVar59 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                        for (; (long)uVar39 <= (long)psVar30->spec_end; uVar39 = uVar39 + 1) {
                          bVar12 = ""[uVar39];
                          if (((psVar62[bVar12] != 0) &&
                              (iVar21 = stbi__jpeg_get_bit(psVar30), iVar21 != 0)) &&
                             (sVar43 = psVar62[bVar12], (uVar59 & (int)sVar43) == 0)) {
                            uVar52 = -uVar59;
                            if (0 < sVar43) {
                              uVar52 = uVar59;
                            }
                            psVar62[bVar12] = (short)uVar52 + sVar43;
                          }
                        }
                      }
                    }
                    iVar21 = psVar30->todo;
                    psVar30->todo = iVar21 + -1;
                    if (iVar21 < 2) {
                      if (psVar30->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar30);
                      }
                      bVar12 = psVar30->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_00149cb3;
                      stbi__jpeg_reset(psVar30);
                    }
                  }
                }
              }
              else {
                for (iVar19 = 0; iVar19 < psVar30->img_mcu_y; iVar19 = iVar19 + 1) {
                  for (iVar26 = 0; iVar26 < psVar30->img_mcu_x; iVar26 = iVar26 + 1) {
                    for (lVar32 = 0; lVar32 < psVar30->scan_n; lVar32 = lVar32 + 1) {
                      iVar51 = psVar30->order[lVar32];
                      for (iVar46 = 0; iVar46 < paVar1[iVar51].v; iVar46 = iVar46 + 1) {
                        iVar47 = 0;
                        while (iVar47 < paVar1[iVar51].h) {
                          iVar21 = stbi__jpeg_decode_block_prog_dc
                                             (psVar30,paVar1[iVar51].coeff +
                                                      (paVar1[iVar51].h * iVar26 + iVar47 +
                                                      (paVar1[iVar51].v * iVar19 + iVar46) *
                                                      paVar1[iVar51].coeff_w) * 0x40,
                                              (stbi__huffman *)
                                              psVar30->huff_dc[paVar1[iVar51].hd].fast,iVar51);
                          iVar47 = iVar47 + 1;
                          if (iVar21 == 0) goto LAB_00149e62;
                        }
                      }
                    }
                    iVar51 = psVar30->todo;
                    psVar30->todo = iVar51 + -1;
                    if (iVar51 < 2) {
                      if (psVar30->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar30);
                      }
                      bVar12 = psVar30->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_00149cb3;
                      stbi__jpeg_reset(psVar30);
                    }
                  }
                }
              }
              bVar12 = psVar30->marker;
LAB_00149cb3:
              if (bVar12 == 0xff) {
                do {
                  iVar19 = stbi__at_eof(psVar30->s);
                  if (iVar19 != 0) goto LAB_0014926e;
                  sVar14 = stbi__get8(psVar30->s);
                } while (sVar14 != 0xff);
                sVar14 = stbi__get8(psVar30->s);
                psVar30->marker = sVar14;
              }
              goto LAB_0014926e;
            }
          }
LAB_00149e52:
          *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
          goto LAB_00149e62;
        }
        if (bVar12 == 0xdc) {
          iVar19 = stbi__get16be(psVar30->s);
          sVar20 = stbi__get16be(psVar30->s);
          if ((iVar19 != 4) || (sVar20 != psVar30->s->img_y)) goto LAB_00149e52;
LAB_0014926e:
          bVar12 = stbi__get_marker(psVar30);
          goto LAB_0014920a;
        }
        if (bVar12 != 0xd9) {
          iVar19 = stbi__process_marker(psVar30,(uint)bVar12);
          if (iVar19 != 0) goto LAB_0014926e;
          goto LAB_00149e62;
        }
        if (psVar30->progressive == 0) {
          psVar49 = psVar30->s;
          uVar59 = psVar49->img_n;
        }
        else {
          lVar32 = 0;
          while( true ) {
            psVar49 = psVar30->s;
            uVar59 = psVar49->img_n;
            if ((int)uVar59 <= lVar32) break;
            uVar59 = psVar30->img_comp[lVar32].x + 7 >> 3;
            iVar19 = psVar30->img_comp[lVar32].y + 7 >> 3;
            uVar54 = 0;
            uVar39 = (ulong)uVar59;
            if ((int)uVar59 < 1) {
              uVar39 = uVar54;
            }
            if (iVar19 < 1) {
              iVar19 = 0;
            }
            while (iVar26 = (int)uVar54, iVar26 != iVar19) {
              for (uVar54 = 0; uVar54 != uVar39; uVar54 = uVar54 + 1) {
                psVar62 = paVar1[lVar32].coeff;
                iVar46 = paVar1[lVar32].coeff_w * iVar26;
                iVar51 = paVar1[lVar32].tq;
                iVar47 = iVar46 + (int)uVar54;
                for (lVar48 = 0; lVar48 != 0x40; lVar48 = lVar48 + 1) {
                  psVar62[iVar47 * 0x40 + lVar48] =
                       psVar62[iVar47 * 0x40 + lVar48] * psVar30->dequant[iVar51][lVar48];
                }
                (*psVar30->idct_block_kernel)
                          (paVar1[lVar32].data + uVar54 * 8 + (long)(iVar26 * 8 * paVar1[lVar32].w2)
                           ,paVar1[lVar32].w2,psVar62 + (iVar46 + (int)uVar54) * 0x40);
              }
              uVar54 = (ulong)(iVar26 + 1);
            }
            lVar32 = lVar32 + 1;
          }
        }
        uVar52 = (2 < (int)uVar59) + 1 + (uint)(2 < (int)uVar59);
        if (req_comp != 0) {
          uVar52 = req_comp;
        }
        lVar32 = 0;
        bVar63 = false;
        if ((uVar59 == 3) && (bVar63 = true, psVar30->rgb != 3)) {
          if (psVar30->app14_color_transform == 0) {
            bVar63 = psVar30->jfif == 0;
          }
          else {
            bVar63 = false;
          }
        }
        uVar39 = 0;
        if (0 < (int)uVar59) {
          uVar39 = (ulong)uVar59;
        }
        uVar54 = 1;
        if (bVar63) {
          uVar54 = uVar39;
        }
        if (2 < (int)uVar52) {
          uVar54 = uVar39;
        }
        coutput[2] = (stbi_uc *)0x0;
        coutput[3] = (stbi_uc *)0x0;
        coutput[0] = (stbi_uc *)0x0;
        coutput[1] = (stbi_uc *)0x0;
        if (uVar59 != 3) {
          uVar54 = uVar39;
        }
        do {
          if (uVar54 * 0x30 == lVar32) {
            sVar20 = psVar49->img_y;
            data_00 = (stbi__context *)stbi__malloc_mad3(uVar52,psVar49->img_x,sVar20,1);
            if (data_00 != (stbi__context *)0x0) {
              iVar19 = 0;
              uVar59 = 0;
              do {
                if (sVar20 <= uVar59) {
                  stbi__cleanup_jpeg(psVar30);
                  psVar49 = psVar30->s;
                  *x = psVar49->img_x;
                  *y = psVar49->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar49->img_n) * 2 + 1;
                  }
                  goto LAB_00149e71;
                }
                sVar20 = psVar49->img_x;
                ppsVar57 = coutput;
                for (lVar32 = 0; uVar54 * 0x30 != lVar32; lVar32 = lVar32 + 0x30) {
                  puVar37 = (undefined8 *)((long)data + lVar32 + 0x10);
                  iVar26 = *(int *)((long)data + lVar32 + 0x24);
                  iVar51 = *(int *)((long)data + lVar32 + 0x1c);
                  iVar46 = iVar51 >> 1;
                  puVar2 = (undefined8 *)((long)data + lVar32 + 8);
                  puVar40 = puVar37;
                  if (iVar26 < iVar46) {
                    puVar40 = puVar2;
                  }
                  if (iVar46 <= iVar26) {
                    puVar37 = puVar2;
                  }
                  psVar38 = (stbi_uc *)
                            (**(code **)((long)data + lVar32))
                                      (*(undefined8 *)
                                        ((long)&psVar30->img_comp[0].linebuf + lVar32 * 2),*puVar40,
                                       *puVar37,*(undefined4 *)((long)data + lVar32 + 0x20));
                  *ppsVar57 = psVar38;
                  *(int *)((long)data + lVar32 + 0x24) = iVar26 + 1;
                  if (iVar51 <= iVar26 + 1) {
                    *(undefined4 *)((long)data + lVar32 + 0x24) = 0;
                    lVar48 = *(long *)((long)data + lVar32 + 0x10);
                    *(long *)((long)data + lVar32 + 8) = lVar48;
                    iVar26 = *(int *)((long)data + lVar32 + 0x28) + 1;
                    *(int *)((long)data + lVar32 + 0x28) = iVar26;
                    if (iVar26 < *(int *)((long)&psVar30->img_comp[0].y + lVar32 * 2)) {
                      *(long *)((long)data + lVar32 + 0x10) =
                           lVar48 + *(int *)((long)&psVar30->img_comp[0].w2 + lVar32 * 2);
                    }
                  }
                  ppsVar57 = ppsVar57 + 1;
                }
                if ((int)uVar52 < 3) {
                  psVar49 = psVar30->s;
                  if (bVar63) {
                    if (uVar52 == 1) {
                      for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                        data_00->buffer_start[uVar39 + sVar20 * iVar19 + -0x38] =
                             (stbi_uc)((uint)coutput[2][uVar39] * 0x1d +
                                       (uint)coutput[1][uVar39] * 0x96 +
                                       (uint)coutput[0][uVar39] * 0x4d >> 8);
                      }
                    }
                    else {
                      for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                        data_00->buffer_start[uVar39 * 2 + (ulong)(sVar20 * iVar19) + -0x38] =
                             (stbi_uc)((uint)coutput[2][uVar39] * 0x1d +
                                       (uint)coutput[1][uVar39] * 0x96 +
                                       (uint)coutput[0][uVar39] * 0x4d >> 8);
                        data_00->buffer_start[uVar39 * 2 + (ulong)(sVar20 * iVar19) + -0x37] = 0xff;
                      }
                    }
                  }
                  else if (psVar49->img_n == 4) {
                    if (psVar30->app14_color_transform == 2) {
                      psVar38 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                        iVar26 = (coutput[0][uVar39] ^ 0xff) * (uint)coutput[3][uVar39];
                        psVar38[-1] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        *psVar38 = 0xff;
                        psVar38 = psVar38 + uVar52;
                      }
                    }
                    else {
                      if (psVar30->app14_color_transform != 0) goto LAB_0014b2e5;
                      psVar38 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                        bVar12 = coutput[3][uVar39];
                        iVar26 = (uint)coutput[0][uVar39] * (uint)bVar12;
                        iVar51 = (uint)coutput[1][uVar39] * (uint)bVar12;
                        psVar38[-1] = (char)((((uint)coutput[2][uVar39] * (uint)bVar12 + 0x80 >> 8)
                                              + (uint)coutput[2][uVar39] * (uint)bVar12 + 0x80 >> 8)
                                             * 0x1d + (iVar51 + (iVar51 + 0x80U >> 8) + 0x80 >> 8) *
                                                      0x96 + (iVar26 + (iVar26 + 0x80U >> 8) + 0x80
                                                             >> 8) * 0x4d >> 8);
                        *psVar38 = 0xff;
                        psVar38 = psVar38 + uVar52;
                      }
                    }
                  }
                  else {
LAB_0014b2e5:
                    if (uVar52 == 1) {
                      for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                        data_00->buffer_start[uVar39 + sVar20 * iVar19 + -0x38] = coutput[0][uVar39]
                        ;
                      }
                    }
                    else {
                      for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                        data_00->buffer_start[uVar39 * 2 + (ulong)(sVar20 * iVar19) + -0x38] =
                             coutput[0][uVar39];
                        data_00->buffer_start[uVar39 * 2 + (ulong)(sVar20 * iVar19) + -0x37] = 0xff;
                      }
                    }
                  }
                }
                else {
                  psVar49 = psVar30->s;
                  if (psVar49->img_n == 3) {
                    if (bVar63) {
                      psVar38 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                        psVar38[-3] = coutput[0][uVar39];
                        psVar38[-2] = coutput[1][uVar39];
                        psVar38[-1] = coutput[2][uVar39];
                        *psVar38 = 0xff;
                        psVar38 = psVar38 + uVar52;
                      }
                    }
                    else {
LAB_0014b320:
                      (*psVar30->YCbCr_to_RGB_kernel)
                                (data_00->buffer_start + ((ulong)(uVar59 * uVar52 * sVar20) - 0x38),
                                 coutput[0],coutput[1],coutput[2],psVar49->img_x,uVar52);
                    }
                  }
                  else if (psVar49->img_n == 4) {
                    if (psVar30->app14_color_transform == 2) {
                      (*psVar30->YCbCr_to_RGB_kernel)
                                (data_00->buffer_start + ((ulong)(uVar59 * uVar52 * sVar20) - 0x38),
                                 coutput[0],coutput[1],coutput[2],psVar49->img_x,uVar52);
                      psVar49 = psVar30->s;
                      psVar38 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x36);
                      for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                        bVar12 = coutput[3][uVar39];
                        iVar26 = (psVar38[-2] ^ 0xff) * (uint)bVar12;
                        psVar38[-2] = (byte)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        iVar26 = (psVar38[-1] ^ 0xff) * (uint)bVar12;
                        psVar38[-1] = (byte)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        iVar26 = (*psVar38 ^ 0xff) * (uint)bVar12;
                        *psVar38 = (byte)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        psVar38 = psVar38 + uVar52;
                      }
                    }
                    else {
                      if (psVar30->app14_color_transform != 0) goto LAB_0014b320;
                      psVar38 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                        bVar12 = coutput[3][uVar39];
                        iVar26 = (uint)coutput[0][uVar39] * (uint)bVar12;
                        psVar38[-3] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        iVar26 = (uint)coutput[1][uVar39] * (uint)bVar12;
                        psVar38[-2] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        psVar38[-1] = (char)(((uint)coutput[2][uVar39] * (uint)bVar12 + 0x80 >> 8) +
                                             (uint)coutput[2][uVar39] * (uint)bVar12 + 0x80 >> 8);
                        *psVar38 = 0xff;
                        psVar38 = psVar38 + uVar52;
                      }
                    }
                  }
                  else {
                    psVar38 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                    for (uVar39 = 0; uVar39 < psVar49->img_x; uVar39 = uVar39 + 1) {
                      sVar14 = coutput[0][uVar39];
                      psVar38[-1] = sVar14;
                      psVar38[-2] = sVar14;
                      psVar38[-3] = sVar14;
                      *psVar38 = 0xff;
                      psVar38 = psVar38 + uVar52;
                    }
                  }
                }
                uVar59 = uVar59 + 1;
                psVar49 = psVar30->s;
                sVar20 = psVar49->img_y;
                iVar19 = iVar19 + uVar52;
              } while( true );
            }
            stbi__cleanup_jpeg(psVar30);
LAB_0014b4fa:
            pcVar31 = "Out of memory";
            goto LAB_00149125;
          }
          sVar20 = psVar49->img_x;
          pvVar35 = malloc((ulong)(sVar20 + 3));
          *(void **)((long)&psVar30->img_comp[0].linebuf + lVar32 * 2) = pvVar35;
          if (pvVar35 == (void *)0x0) {
            stbi__cleanup_jpeg(psVar30);
            goto LAB_0014b4fa;
          }
          uVar39 = (long)psVar30->img_h_max /
                   (long)*(int *)((long)&psVar30->img_comp[0].h + lVar32 * 2);
          iVar19 = (int)uVar39;
          *(int *)((long)data + lVar32 + 0x18) = iVar19;
          iVar26 = psVar30->img_v_max / *(int *)((long)&psVar30->img_comp[0].v + lVar32 * 2);
          *(int *)((long)data + lVar32 + 0x1c) = iVar26;
          *(int *)((long)data + lVar32 + 0x24) = iVar26 >> 1;
          *(int *)((long)data + lVar32 + 0x20) =
               (int)((ulong)((iVar19 + sVar20) - 1) / (uVar39 & 0xffffffff));
          *(undefined4 *)((long)data + lVar32 + 0x28) = 0;
          uVar8 = *(undefined8 *)((long)&psVar30->img_comp[0].data + lVar32 * 2);
          *(undefined8 *)((long)data + lVar32 + 0x10) = uVar8;
          *(undefined8 *)((long)data + lVar32 + 8) = uVar8;
          if (iVar19 == 2) {
            pcVar36 = stbi__resample_row_h_2;
            if (iVar26 != 1) {
              if (iVar26 != 2) goto LAB_0014ae1f;
              pcVar36 = psVar30->resample_row_hv_2_kernel;
            }
          }
          else if (iVar19 == 1) {
            pcVar36 = stbi__resample_row_generic;
            if (iVar26 == 2) {
              pcVar36 = stbi__resample_row_v_2;
            }
            if (iVar26 == 1) {
              pcVar36 = resample_row_1;
            }
          }
          else {
LAB_0014ae1f:
            pcVar36 = stbi__resample_row_generic;
          }
          *(code **)((long)data + lVar32) = pcVar36;
          lVar32 = lVar32 + 0x30;
        } while( true );
      }
LAB_00149e62:
      stbi__cleanup_jpeg(psVar30);
    }
    else {
      pcVar31 = "Internal error";
LAB_00149125:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
    }
    data_00 = (stbi__context *)0x0;
    goto LAB_00149e71;
  }
  iVar19 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar19 != 0) {
    if ((uint)req_comp < 5) {
      data._0_8_ = s;
      iVar19 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
      uVar8 = data._0_8_;
      if (iVar19 == 0) {
        data_00 = (stbi__context *)0x0;
      }
      else {
        if ((int)data._32_4_ < 9) {
          iVar19 = 8;
        }
        else {
          if (data._32_4_ != 0x10) {
            pcVar31 = "PNG not supported: unsupported color depth";
            goto LAB_0014917c;
          }
          iVar19 = 0x10;
        }
        ri->bits_per_channel = iVar19;
        if ((req_comp != 0) && (iVar19 = *(int *)(data._0_8_ + 0xc), iVar19 != req_comp)) {
          if ((int)data._32_4_ < 9) {
            data._24_8_ = stbi__convert_format
                                    ((uchar *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                                     *(uint *)(data._0_8_ + 4));
          }
          else {
            data._24_8_ = stbi__convert_format16
                                    ((stbi__uint16 *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_
                                     ,*(uint *)(data._0_8_ + 4));
          }
          *(int *)(uVar8 + 0xc) = req_comp;
          if ((stbi__context *)data._24_8_ == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(int *)uVar8;
        *y = *(int *)(uVar8 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar8 + 8);
        }
        data_00 = (stbi__context *)data._24_8_;
        data._24_8_ = (void *)0x0;
      }
      free((void *)data._24_8_);
      free((void *)data._16_8_);
      psVar30 = (stbi__jpeg *)data._8_8_;
      goto LAB_00149e71;
    }
    pcVar31 = "Internal error";
    goto LAB_0014917c;
  }
  sVar14 = stbi__get8(s);
  if ((sVar14 == 'B') && (sVar14 = stbi__get8(s), sVar14 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar20 = stbi__get32le(s);
    if (((0x38 < sVar20) || ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) == 0)) &&
       ((sVar20 != 0x7c && (sVar20 != 0x6c)))) goto LAB_00149ebc;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    coutput[3] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[3]);
    pvVar35 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
    if (pvVar35 == (void *)0x0) {
      return (void *)0x0;
    }
    sVar20 = s->img_y;
    uVar59 = -sVar20;
    if (0 < (int)sVar20) {
      uVar59 = sVar20;
    }
    s->img_y = uVar59;
    if ((0x1000000 < uVar59) || (uVar52 = s->img_x, 0x1000000 < uVar52)) {
LAB_0014a8c3:
      pcVar31 = "Very large image (corrupt?)";
      goto LAB_0014917c;
    }
    uVar29 = (uint)coutput[3];
    local_8968._0_4_ = coutput[3]._4_4_;
    if ((int)coutput[1] != 0xc) {
      if ((int)coutput[0] < 0x10) {
        uVar27 = (int)(coutput[0]._4_4_ - (local_88d8 + (int)coutput[1])) >> 2;
        goto LAB_0014a923;
      }
LAB_0014a938:
      if (coutput[0]._4_4_ !=
          ((int)s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read) {
        __assert_fail("info.offset == s->callback_already_read + (int) (s->img_buffer - s->img_buffer_original)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                      ,0x1515,
                      "void *stbi__bmp_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                     );
      }
      if (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 ==
          (stbi_uc *)(long)(int)coutput[0]._4_4_) {
        uVar27 = 0;
        bVar63 = true;
        if ((int)coutput[0] != 0x18 || (uint)coutput[3] != 0xff000000) goto LAB_0014aa0e;
        bVar11 = true;
        uVar27 = 0;
        iVar26 = 3;
        iVar19 = 0x18;
        bVar63 = true;
        goto LAB_0014aa2e;
      }
LAB_0014b714:
      pcVar31 = "Corrupt BMP";
      goto LAB_0014917c;
    }
    if (0x17 < (int)coutput[0]) goto LAB_0014a938;
    uVar27 = (int)((coutput[0]._4_4_ - local_88d8) + -0x18) / 3;
LAB_0014a923:
    if (uVar27 == 0) goto LAB_0014a938;
    bVar63 = false;
LAB_0014aa0e:
    bVar11 = (uint)coutput[3] == 0xff000000;
    iVar26 = 4 - (uint)((uint)coutput[3] == 0);
    iVar19 = (int)coutput[0];
LAB_0014aa2e:
    s->img_n = iVar26;
    if (2 < req_comp) {
      iVar26 = req_comp;
    }
    iVar51 = stbi__mad3sizes_valid(iVar26,uVar52,uVar59,0);
    if (iVar51 == 0) goto LAB_0014b714;
    puVar34 = (uchar *)stbi__malloc_mad3(iVar26,uVar52,uVar59,0);
    if (puVar34 != (uchar *)0x0) {
      if (iVar19 < 0x10) {
        if (!bVar63 && (int)uVar27 < 0x101) {
          uVar39 = 0;
          uVar54 = 0;
          if (0 < (int)uVar27) {
            uVar54 = (ulong)uVar27;
          }
          for (; uVar54 != uVar39; uVar39 = uVar39 + 1) {
            sVar14 = stbi__get8(s);
            *(stbi_uc *)(data + uVar39 * 2 + 1) = sVar14;
            sVar14 = stbi__get8(s);
            *(stbi_uc *)((long)data + uVar39 * 4 + 1) = sVar14;
            sVar14 = stbi__get8(s);
            *(stbi_uc *)(data + uVar39 * 2) = sVar14;
            if ((int)coutput[1] != 0xc) {
              stbi__get8(s);
            }
            *(undefined1 *)((long)data + uVar39 * 4 + 3) = 0xff;
          }
          stbi__skip(s,(uVar27 * ((int)coutput[1] == 0xc | 0xfffffffc) + coutput[0]._4_4_) -
                       ((int)coutput[1] + local_88d8));
          if (iVar19 == 1) {
            sVar25 = s->img_x;
            iVar19 = 0;
            uVar39 = 0;
LAB_0014ba3f:
            sVar24 = s->img_y;
            if (iVar19 < (int)sVar24) {
              iVar51 = 0;
              do {
                bVar12 = stbi__get8(s);
                sVar24 = s->img_x;
                iVar46 = 8;
                do {
                  if ((int)sVar24 <= iVar51) {
LAB_0014bada:
                    uVar39 = uVar39 & 0xffffffff;
                    stbi__skip(s,-(sVar25 + 7 >> 3) & 3);
                    iVar19 = iVar19 + 1;
                    goto LAB_0014ba3f;
                  }
                  uVar54 = (ulong)((bVar12 >> (iVar46 - 1U & 0x1f) & 1) != 0);
                  iVar47 = (int)uVar39;
                  lVar32 = (long)iVar47;
                  uVar39 = lVar32 + 3;
                  puVar34[lVar32] = (uchar)data[uVar54 * 2];
                  puVar34[lVar32 + 1] = *(uchar *)((long)data + uVar54 * 4 + 1);
                  puVar34[lVar32 + 2] = (uchar)data[uVar54 * 2 + 1];
                  if (iVar26 == 4) {
                    puVar34[lVar32 + 3] = 0xff;
                    uVar39 = (ulong)(iVar47 + 4);
                  }
                  if (sVar24 - 1 == iVar51) goto LAB_0014bada;
                  iVar51 = iVar51 + 1;
                  iVar47 = iVar46 + -1;
                  bVar63 = 0 < iVar46;
                  iVar46 = iVar47;
                } while (iVar47 != 0 && bVar63);
              } while( true );
            }
            goto LAB_0014bc18;
          }
          if (iVar19 == 8) {
            uVar59 = s->img_x;
          }
          else {
            if (iVar19 != 4) goto LAB_0014b70c;
            uVar59 = s->img_x + 1 >> 1;
          }
          local_8958 = -uVar59 & 3;
          uVar39 = 0;
          for (iVar51 = 0; sVar24 = s->img_y, iVar51 < (int)sVar24; iVar51 = iVar51 + 1) {
            for (iVar46 = 0; iVar46 < (int)s->img_x; iVar46 = iVar46 + 2) {
              bVar12 = stbi__get8(s);
              uVar59 = (uint)(bVar12 >> 4);
              if (iVar19 != 4) {
                uVar59 = (uint)bVar12;
              }
              uVar54 = (ulong)uVar59;
              uVar59 = bVar12 & 0xf;
              if (iVar19 != 4) {
                uVar59 = 0;
              }
              lVar32 = (long)(int)uVar39;
              uVar41 = lVar32 + 3;
              puVar34[lVar32] = (uchar)data[uVar54 * 2];
              puVar34[lVar32 + 1] = *(uchar *)((long)data + uVar54 * 4 + 1);
              puVar34[lVar32 + 2] = (uchar)data[uVar54 * 2 + 1];
              if (iVar26 == 4) {
                puVar34[lVar32 + 3] = 0xff;
                uVar41 = (ulong)((int)uVar39 + 4);
              }
              if (iVar46 + 1U == s->img_x) {
                uVar39 = uVar41 & 0xffffffff;
                break;
              }
              if (iVar19 == 8) {
                bVar12 = stbi__get8(s);
                uVar59 = (uint)bVar12;
              }
              lVar32 = (long)(int)uVar41;
              uVar39 = lVar32 + 3;
              uVar54 = (ulong)uVar59;
              puVar34[lVar32] = (uchar)data[uVar54 * 2];
              puVar34[lVar32 + 1] = *(uchar *)((long)data + uVar54 * 4 + 1);
              puVar34[lVar32 + 2] = (uchar)data[uVar54 * 2 + 1];
              if (iVar26 == 4) {
                puVar34[lVar32 + 3] = 0xff;
                uVar39 = (ulong)((int)uVar41 + 4);
              }
            }
            stbi__skip(s,local_8958);
          }
          goto LAB_0014bc18;
        }
      }
      else {
        stbi__skip(s,coutput[0]._4_4_ - ((int)coutput[1] + local_88d8));
        if (iVar19 != 0x10) {
          if (iVar19 == 0x20) {
            local_88fc = 0;
            if (!(bool)(bVar11 & (coutput[1]._4_4_ == 0xff0000 &&
                                 ((uint)coutput[2] == 0xff00 && coutput[2]._4_4_ == 0xff))))
            goto LAB_0014b646;
            bVar63 = true;
          }
          else {
            local_88fc = 0;
            if (iVar19 != 0x18) goto LAB_0014b646;
            local_88fc = s->img_x & 3;
            bVar63 = false;
          }
          bVar11 = false;
          iVar47 = 0;
          iVar51 = 0;
          local_8910 = 0;
          iVar46 = 0;
          uVar59 = 0;
          uVar52 = 0;
          local_8900 = 0;
          local_88b8 = 0;
LAB_0014b89a:
          iVar22 = 0;
          for (iVar21 = 0; sVar24 = s->img_y, iVar21 < (int)sVar24; iVar21 = iVar21 + 1) {
            if (bVar11) {
              for (iVar23 = 0; iVar23 < (int)s->img_x; iVar23 = iVar23 + 1) {
                if (iVar19 == 0x10) {
                  uVar27 = stbi__get16le(s);
                }
                else {
                  uVar27 = stbi__get32le(s);
                }
                iVar28 = stbi__shiftsigned(uVar27 & coutput[1]._4_4_,iVar47,uVar59);
                puVar34[iVar22] = (uchar)iVar28;
                iVar28 = stbi__shiftsigned(uVar27 & (uint)coutput[2],iVar51,uVar52);
                puVar34[(long)iVar22 + 1] = (uchar)iVar28;
                iVar28 = stbi__shiftsigned(uVar27 & coutput[2]._4_4_,local_8910,local_8900);
                puVar34[(long)iVar22 + 2] = (uchar)iVar28;
                if (uVar29 == 0) {
                  uVar27 = 0xff;
                }
                else {
                  uVar27 = stbi__shiftsigned(uVar27 & uVar29,iVar46,local_88b8);
                }
                iVar28 = iVar22 + 3;
                if (iVar26 == 4) {
                  puVar34[(long)iVar22 + 3] = (uchar)uVar27;
                  iVar28 = iVar22 + 4;
                }
                iVar22 = iVar28;
                local_8968._0_4_ = (uint)local_8968 | uVar27;
              }
            }
            else {
              for (iVar23 = 0; iVar23 < (int)s->img_x; iVar23 = iVar23 + 1) {
                sVar14 = stbi__get8(s);
                puVar34[(long)iVar22 + 2] = sVar14;
                sVar14 = stbi__get8(s);
                puVar34[(long)iVar22 + 1] = sVar14;
                sVar14 = stbi__get8(s);
                puVar34[iVar22] = sVar14;
                bVar12 = 0xff;
                if (bVar63) {
                  bVar12 = stbi__get8(s);
                }
                iVar28 = iVar22 + 3;
                if (iVar26 == 4) {
                  puVar34[(long)iVar22 + 3] = bVar12;
                  iVar28 = iVar22 + 4;
                }
                iVar22 = iVar28;
                local_8968._0_4_ = (uint)local_8968 | bVar12;
              }
            }
            stbi__skip(s,local_88fc);
          }
LAB_0014bc18:
          if ((iVar26 == 4) && ((uint)local_8968 == 0)) {
            for (uVar59 = s->img_x * sVar24 * 4 - 1; -1 < (int)uVar59; uVar59 = uVar59 - 4) {
              puVar34[uVar59] = 0xff;
            }
          }
          if (0 < (int)sVar20) {
            iVar19 = (int)sVar24 >> 1;
            if ((int)sVar24 >> 1 < 1) {
              iVar19 = 0;
            }
            iVar47 = (sVar24 - 1) * iVar26;
            iVar46 = 0;
            for (iVar51 = 0; iVar51 != iVar19; iVar51 = iVar51 + 1) {
              sVar20 = s->img_x;
              uVar39 = (ulong)(sVar20 * iVar26);
              if ((int)(sVar20 * iVar26) < 1) {
                uVar39 = 0;
              }
              for (uVar54 = 0; uVar39 != uVar54; uVar54 = uVar54 + 1) {
                uVar4 = puVar34[uVar54 + sVar20 * iVar46];
                puVar34[uVar54 + sVar20 * iVar46] = puVar34[uVar54 + sVar20 * iVar47];
                puVar34[uVar54 + sVar20 * iVar47] = uVar4;
              }
              iVar47 = iVar47 - iVar26;
              iVar46 = iVar46 + iVar26;
            }
          }
          uVar59 = s->img_x;
          if ((req_comp != 0) && (iVar26 != req_comp)) {
            puVar34 = stbi__convert_format(puVar34,iVar26,req_comp,uVar59,sVar24);
            if (puVar34 == (uchar *)0x0) {
              return (void *)0x0;
            }
            uVar59 = s->img_x;
          }
          *x = uVar59;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return puVar34;
          }
          return puVar34;
        }
        local_88fc = s->img_x * 2 & 2;
LAB_0014b646:
        if (((uint)coutput[2] != 0 && coutput[1]._4_4_ != 0) && coutput[2]._4_4_ != 0) {
          iVar47 = stbi__high_bit(coutput[1]._4_4_);
          uVar59 = stbi__bitcount(coutput[1]._4_4_);
          iVar51 = stbi__high_bit((uint)coutput[2]);
          uVar52 = stbi__bitcount((uint)coutput[2]);
          local_8910 = stbi__high_bit(coutput[2]._4_4_);
          local_8900 = stbi__bitcount(coutput[2]._4_4_);
          iVar46 = stbi__high_bit(uVar29);
          local_88b8 = stbi__bitcount(uVar29);
          if ((local_8900 < 9 && (uVar52 < 9 && uVar59 < 9)) && local_88b8 < 9) {
            iVar47 = iVar47 + -7;
            iVar51 = iVar51 + -7;
            local_8910 = local_8910 + -7;
            iVar46 = iVar46 + -7;
            bVar11 = true;
            bVar63 = false;
            goto LAB_0014b89a;
          }
        }
      }
LAB_0014b70c:
      free(puVar34);
      goto LAB_0014b714;
    }
    goto LAB_0014ab87;
  }
LAB_00149ebc:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar19 = stbi__gif_test(s);
  if (iVar19 != 0) {
    memset((stbi__gif *)data,0,0x8870);
    data_00 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)data,comp,0,psVar38);
    if (data_00 == (stbi__context *)0x0 || data_00 == s) {
      free((void *)data._8_8_);
      data_00 = (stbi__context *)0x0;
    }
    else {
      *x = data._0_4_;
      *y = data._4_4_;
      if ((req_comp & 0xfffffffbU) != 0) {
        data_00 = (stbi__context *)
                  stbi__convert_format((uchar *)data_00,4,req_comp,data._0_4_,data._4_4_);
      }
    }
    free((void *)data._24_8_);
    psVar30 = (stbi__jpeg *)data._16_8_;
LAB_00149e71:
    free(psVar30);
    return data_00;
  }
  sVar20 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar20 == 0x38425053) {
    sVar20 = stbi__get32be(s);
    if (sVar20 != 0x38425053) {
      pcVar31 = "Corrupt PSD image";
      goto LAB_0014917c;
    }
    iVar19 = stbi__get16be(s);
    if (iVar19 != 1) {
      pcVar31 = "Unsupported version of PSD image";
      goto LAB_0014917c;
    }
    stbi__skip(s,6);
    uVar59 = stbi__get16be(s);
    if (0x10 < uVar59) {
      pcVar31 = "Unsupported number of channels in PSD image";
      goto LAB_0014917c;
    }
    sVar20 = stbi__get32be(s);
    sVar24 = stbi__get32be(s);
    if ((0x1000000 < (int)sVar20) || (0x1000000 < (int)sVar24)) goto LAB_0014a8c3;
    iVar19 = stbi__get16be(s);
    if ((iVar19 != 8) && (iVar19 != 0x10)) {
      pcVar31 = "PSD bit depth is not 8 or 16 bit";
      goto LAB_0014917c;
    }
    iVar26 = stbi__get16be(s);
    if (iVar26 != 3) {
      pcVar31 = "PSD is not in RGB color format";
      goto LAB_0014917c;
    }
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    uVar52 = stbi__get16be(s);
    if (1 < uVar52) {
      pcVar31 = "PSD has an unknown compression format";
      goto LAB_0014917c;
    }
    iVar26 = stbi__mad3sizes_valid(4,sVar24,sVar20,0);
    if (iVar26 == 0) {
      pcVar31 = "Corrupt PSD";
      goto LAB_0014917c;
    }
    if (((bpc == 0x10) && (iVar19 == 0x10)) && (uVar52 == 0)) {
      local_8968 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar24,sVar20,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      local_8968 = (stbi__uint16 *)malloc((long)(int)(sVar20 * sVar24 * 4));
    }
    if (local_8968 != (stbi__uint16 *)0x0) {
      uVar29 = sVar24 * sVar20;
      if (uVar52 == 0) {
        uVar39 = 0;
        psVar44 = local_8968;
        psVar58 = local_8968;
        uVar52 = 0;
        if (0 < (int)uVar29) {
          uVar52 = uVar29;
        }
        for (; uVar39 != 4; uVar39 = uVar39 + 1) {
          if (uVar39 < uVar59) {
            if (ri->bits_per_channel == 0x10) {
              for (lVar32 = 0; uVar52 != (uint)lVar32; lVar32 = lVar32 + 1) {
                iVar26 = stbi__get16be(s);
                psVar58[lVar32 * 4] = (stbi__uint16)iVar26;
              }
            }
            else if (iVar19 == 0x10) {
              for (lVar32 = 0; uVar52 != (uint)lVar32; lVar32 = lVar32 + 1) {
                iVar26 = stbi__get16be(s);
                *(char *)(psVar44 + lVar32 * 2) = (char)((uint)iVar26 >> 8);
              }
            }
            else {
              for (lVar32 = 0; uVar52 != (uint)lVar32; lVar32 = lVar32 + 1) {
                sVar14 = stbi__get8(s);
                *(stbi_uc *)(psVar44 + lVar32 * 2) = sVar14;
              }
            }
          }
          else if (iVar19 == 0x10 && bpc == 0x10) {
            for (lVar32 = 0; uVar52 != (uint)lVar32; lVar32 = lVar32 + 1) {
              psVar58[lVar32 * 4] = -(ushort)(uVar39 == 3);
            }
          }
          else {
            for (lVar32 = 0; uVar52 != (uint)lVar32; lVar32 = lVar32 + 1) {
              *(char *)(psVar44 + lVar32 * 2) = -(uVar39 == 3);
            }
          }
          psVar44 = (stbi__uint16 *)((long)psVar44 + 1);
          psVar58 = psVar58 + 1;
        }
      }
      else {
        stbi__skip(s,sVar20 * uVar59 * 2);
        uVar39 = 0;
        psVar44 = local_8968;
        uVar52 = 0;
        if (0 < (int)uVar29) {
          uVar52 = uVar29;
        }
        for (; uVar39 != 4; uVar39 = uVar39 + 1) {
          if (uVar39 < uVar59) {
            psVar38 = (stbi_uc *)((long)local_8968 + uVar39);
            iVar19 = 0;
            do {
              uVar27 = uVar29 - iVar19;
              do {
                if ((int)uVar27 < 1) goto LAB_0014c017;
                bVar12 = stbi__get8(s);
              } while (bVar12 == 0x80);
              uVar60 = (uint)bVar12;
              if ((char)bVar12 < '\0') {
                uVar61 = 0x101 - uVar60;
                if (uVar27 < uVar61) goto LAB_0014c3ac;
                sVar14 = stbi__get8(s);
                for (iVar26 = uVar60 - 0x101; iVar26 != 0; iVar26 = iVar26 + 1) {
                  *psVar38 = sVar14;
                  psVar38 = psVar38 + 4;
                }
              }
              else {
                if (uVar27 <= bVar12) {
LAB_0014c3ac:
                  free(local_8968);
                  pcVar31 = "bad RLE data";
                  goto LAB_0014917c;
                }
                uVar61 = uVar60 + 1;
                uVar27 = uVar61;
                while (bVar63 = uVar27 != 0, uVar27 = uVar27 - 1, bVar63) {
                  sVar14 = stbi__get8(s);
                  *psVar38 = sVar14;
                  psVar38 = psVar38 + 4;
                }
              }
              iVar19 = iVar19 + uVar61;
            } while( true );
          }
          for (lVar32 = 0; uVar52 != (uint)lVar32; lVar32 = lVar32 + 1) {
            *(char *)(psVar44 + lVar32 * 2) = -(uVar39 == 3);
          }
LAB_0014c017:
          psVar44 = (stbi__uint16 *)((long)psVar44 + 1);
        }
      }
      if (3 < uVar59) {
        uVar39 = 0;
        if (0 < (int)uVar29) {
          uVar39 = (ulong)uVar29;
        }
        if (ri->bits_per_channel == 0x10) {
          for (uVar54 = 0; uVar39 != uVar54; uVar54 = uVar54 + 1) {
            uVar7 = local_8968[uVar54 * 4 + 3];
            if ((uVar7 != 0) && (uVar7 != 0xffff)) {
              fVar65 = 1.0 / ((float)uVar7 / 65535.0);
              fVar64 = (1.0 - fVar65) * 65535.0;
              auVar66._0_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(local_8968 + uVar54 * 4) & 0xffff));
              auVar66._4_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(local_8968 + uVar54 * 4) >> 0x10));
              auVar66._8_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66._12_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66 = pshuflw(auVar66,auVar66,0xe8);
              *(int *)(local_8968 + uVar54 * 4) = auVar66._0_4_;
              local_8968[uVar54 * 4 + 2] =
                   (stbi__uint16)(int)((float)local_8968[uVar54 * 4 + 2] * fVar65 + fVar64);
            }
          }
        }
        else {
          for (uVar54 = 0; uVar39 != uVar54; uVar54 = uVar54 + 1) {
            bVar12 = *(byte *)((long)local_8968 + uVar54 * 4 + 3);
            if ((bVar12 != 0) && (bVar12 != 0xff)) {
              fVar65 = 1.0 / ((float)bVar12 / 255.0);
              fVar64 = (1.0 - fVar65) * 255.0;
              *(char *)(local_8968 + uVar54 * 2) =
                   (char)(int)((float)(byte)local_8968[uVar54 * 2] * fVar65 + fVar64);
              *(char *)((long)local_8968 + uVar54 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)local_8968 + uVar54 * 4 + 1) * fVar65 + fVar64
                              );
              *(char *)(local_8968 + uVar54 * 2 + 1) =
                   (char)(int)((float)(byte)local_8968[uVar54 * 2 + 1] * fVar65 + fVar64);
            }
          }
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          local_8968 = stbi__convert_format16(local_8968,4,req_comp,sVar24,sVar20);
        }
        else {
          local_8968 = (stbi__uint16 *)
                       stbi__convert_format((uchar *)local_8968,4,req_comp,sVar24,sVar20);
        }
        if (local_8968 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar20;
      *x = sVar24;
      return local_8968;
    }
  }
  else {
    iVar19 = stbi__pic_is4(s,anon_var_dwarf_168d6e);
    if (iVar19 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar19 = 0x54;
      while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
        stbi__get8(s);
      }
      iVar19 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar19 != 0) {
        iVar19 = 0x5c;
        while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
          stbi__get8(s);
        }
        uVar59 = stbi__get16be(s);
        uVar52 = stbi__get16be(s);
        iVar19 = stbi__at_eof(s);
        if (iVar19 != 0) {
          pcVar31 = "file too short (pic header)";
          goto LAB_0014917c;
        }
        uVar29 = 0;
        iVar19 = stbi__mad3sizes_valid(uVar59,uVar52,4,0);
        if (iVar19 == 0) {
          pcVar31 = "PIC image too large to decode";
          goto LAB_0014917c;
        }
        stbi__get32be(s);
        stbi__get16be(s);
        stbi__get16be(s);
        psVar30 = (stbi__jpeg *)stbi__malloc_mad3(uVar59,uVar52,4,0);
        memset(psVar30,0xff,(ulong)(uVar59 * 4 * uVar52));
        pbVar56 = (byte *)(data + 1);
        lVar32 = 0;
        do {
          if (lVar32 == 10) {
            pcVar31 = "too many packets";
LAB_0014b51f:
            *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
            goto LAB_0014bd3f;
          }
          sVar14 = stbi__get8(s);
          bVar12 = stbi__get8(s);
          pbVar56[-2] = bVar12;
          bVar13 = stbi__get8(s);
          pbVar56[-1] = bVar13;
          bVar13 = stbi__get8(s);
          *pbVar56 = bVar13;
          iVar19 = stbi__at_eof(s);
          if (iVar19 != 0) {
            pcVar31 = "file too short (reading packets)";
            goto LAB_0014b51f;
          }
          if (bVar12 != 8) {
            pcVar31 = "packet isn\'t 8bpp";
            goto LAB_0014b51f;
          }
          uVar29 = uVar29 | bVar13;
          pbVar56 = pbVar56 + 3;
          lVar32 = lVar32 + 1;
        } while (sVar14 != '\0');
        uVar29 = 4 - ((uVar29 & 0x10) == 0);
        if (comp != (int *)0x0) {
          *comp = uVar29;
        }
        for (uVar39 = 0; uVar39 != uVar52; uVar39 = uVar39 + 1) {
          psVar38 = psVar30->huff_dc[0].fast + (long)(int)(uVar59 * 4 * (int)uVar39) + -8;
          for (lVar48 = 0; lVar32 != lVar48; lVar48 = lVar48 + 1) {
            lVar9 = lVar48 * 3;
            cVar3 = *(char *)((long)data + lVar9 + 1);
            psVar55 = psVar38;
            uVar27 = uVar59;
            if (cVar3 == '\0') {
              while (bVar63 = uVar27 != 0, uVar27 = uVar27 - 1, bVar63) {
                psVar33 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar55);
                if (psVar33 == (stbi_uc *)0x0) goto LAB_0014bd3f;
                psVar55 = psVar55 + 4;
              }
            }
            else if (cVar3 == '\x01') {
              for (; 0 < (int)uVar27; uVar27 = uVar27 - (uVar60 & 0xff)) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) {
                  pcVar31 = "file too short (pure read count)";
                  goto LAB_0014bd28;
                }
                psVar33 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),(stbi_uc *)coutput
                                       );
                if (psVar33 == (stbi_uc *)0x0) goto LAB_0014bd3f;
                uVar60 = (uint)bVar12;
                if (uVar27 < bVar12) {
                  uVar60 = uVar27;
                }
                uVar61 = uVar60 & 0xff;
                while (bVar63 = uVar61 != 0, uVar61 = uVar61 - 1, bVar63) {
                  stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar55,(stbi_uc *)coutput);
                  psVar55 = psVar55 + 4;
                }
              }
            }
            else {
              if (cVar3 != '\x02') {
                pcVar31 = "packet has bad compression type";
LAB_0014c3c9:
                *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
                goto LAB_0014bd3f;
              }
              for (; 0 < (int)uVar27; uVar27 = uVar27 - iVar19) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) {
                  pcVar31 = "file too short (mixed read count)";
LAB_0014bd28:
                  *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
                  goto LAB_0014bd3f;
                }
                uVar60 = (uint)bVar12;
                if (-1 < (char)bVar12) {
                  iVar19 = bVar12 + 1;
                  iVar26 = iVar19;
                  if (uVar60 < uVar27) {
                    while (bVar63 = iVar26 != 0, iVar26 = iVar26 + -1, bVar63) {
                      psVar33 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar55);
                      if (psVar33 == (stbi_uc *)0x0) goto LAB_0014bd3f;
                      psVar55 = psVar55 + 4;
                    }
                    goto LAB_0014a7c6;
                  }
LAB_0014c02e:
                  pcVar31 = "scanline overrun";
                  goto LAB_0014c3c9;
                }
                if (uVar60 == 0x80) {
                  iVar19 = stbi__get16be(s);
                }
                else {
                  iVar19 = uVar60 - 0x7f;
                }
                if ((int)uVar27 < iVar19) goto LAB_0014c02e;
                psVar33 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),(stbi_uc *)coutput
                                       );
                iVar26 = iVar19;
                if (psVar33 == (stbi_uc *)0x0) goto LAB_0014bd3f;
                while (iVar26 != 0) {
                  stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar55,(stbi_uc *)coutput);
                  psVar55 = psVar55 + 4;
                  iVar26 = iVar26 + -1;
                }
LAB_0014a7c6:
              }
            }
          }
        }
        if (psVar30 == (stbi__jpeg *)0x0) {
LAB_0014bd3f:
          free(psVar30);
          psVar30 = (stbi__jpeg *)0x0;
        }
        *x = uVar59;
        *y = uVar52;
        bVar63 = req_comp != 0;
        if (bVar63) {
          uVar29 = req_comp;
        }
        req_comp = uVar29;
        if (!bVar63 && comp != (int *)0x0) {
          req_comp = *comp;
        }
        uVar29 = 4;
        goto LAB_0014bd88;
      }
    }
    sVar14 = stbi__get8(s);
    sVar15 = stbi__get8(s);
    if ((sVar14 == 'P') && (0xfd < (byte)(sVar15 - 0x37))) {
      y_00 = &s->img_y;
      comp_00 = &s->img_n;
      iVar19 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
      if (iVar19 == 0) {
        return (void *)0x0;
      }
      if ((0x1000000 < *y_00) || (0x1000000 < s->img_x)) goto LAB_0014a8c3;
      *x = s->img_x;
      sVar20 = *y_00;
      *y = sVar20;
      iVar19 = *comp_00;
      if (comp != (int *)0x0) {
        *comp = iVar19;
        sVar20 = *y_00;
      }
      sVar24 = s->img_x;
      iVar26 = stbi__mad3sizes_valid(iVar19,sVar24,sVar20,0);
      if (iVar26 == 0) {
        pcVar31 = "PNM too large";
        goto LAB_0014917c;
      }
      puVar34 = (uchar *)stbi__malloc_mad3(iVar19,sVar24,sVar20,0);
      if (puVar34 != (uchar *)0x0) {
        stbi__getn(s,puVar34,sVar20 * iVar19 * sVar24);
        if (req_comp == 0) {
          return puVar34;
        }
        if (*comp_00 != req_comp) {
          puVar34 = stbi__convert_format(puVar34,*comp_00,req_comp,s->img_x,s->img_y);
          return puVar34;
        }
        return puVar34;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar19 = stbi__hdr_test(s);
      if (iVar19 == 0) {
        stbi__get8(s);
        bVar12 = stbi__get8(s);
        if (bVar12 < 2) {
          bVar13 = stbi__get8(s);
          if (bVar12 == 1) {
            if ((bVar13 & 0xf7) == 1) {
              iVar19 = 4;
              stbi__skip(s,4);
              bVar13 = stbi__get8(s);
              if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0))
              goto LAB_0014ac1f;
            }
            goto LAB_0014a8e7;
          }
          if ((bVar13 & 0xf6) != 2) goto LAB_0014a8e7;
          iVar19 = 9;
LAB_0014ac1f:
          stbi__skip(s,iVar19);
          iVar19 = stbi__get16le(s);
          if ((iVar19 == 0) || (iVar19 = stbi__get16le(s), iVar19 == 0)) goto LAB_0014a8e7;
          bVar13 = stbi__get8(s);
          if (bVar12 != 1) {
            if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0)) {
              s->img_buffer = s->img_buffer_original;
              s->img_buffer_end = s->img_buffer_original_end;
              goto LAB_0014b7ab;
            }
            goto LAB_0014a8e7;
          }
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if ((bVar13 - 8 & 0xf7) == 0) {
LAB_0014b7ab:
            bVar13 = stbi__get8(s);
            sVar14 = stbi__get8(s);
            bVar16 = stbi__get8(s);
            iVar19 = stbi__get16le(s);
            uVar27 = stbi__get16le(s);
            bVar12 = stbi__get8(s);
            stbi__get16le(s);
            stbi__get16le(s);
            uVar59 = stbi__get16le(s);
            uVar52 = stbi__get16le(s);
            bVar17 = stbi__get8(s);
            data._0_8_ = (ulong)(uint)data._4_4_ << 0x20;
            bVar18 = stbi__get8(s);
            coutput[0] = (stbi_uc *)((ulong)coutput[0]._4_4_ << 0x20);
            if (sVar14 == '\0') {
              uVar29 = bVar16 - 8;
              if (bVar16 < 8) {
                uVar29 = (uint)bVar16;
              }
              uVar29 = (uint)(uVar29 == 3);
              bVar12 = bVar17;
            }
            else {
              uVar29 = 0;
            }
            uVar29 = stbi__tga_get_comp((uint)bVar12,uVar29,(int *)data);
            if (uVar29 == 0) {
              pcVar31 = "Can\'t find out TGA pixelformat";
              goto LAB_0014917c;
            }
            *x = uVar59;
            *y = uVar52;
            if (comp != (int *)0x0) {
              *comp = uVar29;
            }
            iVar26 = stbi__mad3sizes_valid(uVar59,uVar52,uVar29,0);
            if (iVar26 != 0) {
              psVar30 = (stbi__jpeg *)stbi__malloc_mad3(uVar59,uVar52,uVar29,0);
              if (psVar30 == (stbi__jpeg *)0x0) goto LAB_0014ab87;
              stbi__skip(s,(uint)bVar13);
              uVar39 = (ulong)uVar29;
              if (((sVar14 == '\0') && (bVar16 < 8)) && (data._0_4_ == 0)) {
                uVar60 = 0;
                uVar27 = uVar52;
                while (uVar27 = uVar27 - 1, uVar27 != 0xffffffff) {
                  uVar61 = uVar60;
                  if ((bVar18 >> 5 & 1) == 0) {
                    uVar61 = uVar27;
                  }
                  stbi__getn(s,psVar30->huff_dc[0].fast + (long)(int)(uVar61 * uVar29 * uVar59) + -8
                             ,uVar29 * uVar59);
                  uVar60 = uVar60 + 1;
                }
              }
              else {
                if (sVar14 == '\0') {
                  local_8918 = (stbi__jpeg *)0x0;
                }
                else {
                  if (uVar27 == 0) {
LAB_0014c601:
                    free(psVar30);
                    goto LAB_0014c606;
                  }
                  stbi__skip(s,iVar19);
                  local_8918 = (stbi__jpeg *)stbi__malloc_mad2(uVar27,uVar29,0);
                  if (local_8918 == (stbi__jpeg *)0x0) goto LAB_0014ab82;
                  if (data._0_4_ == 0) {
                    iVar19 = stbi__getn(s,(stbi_uc *)local_8918,uVar29 * uVar27);
                    if (iVar19 == 0) {
                      free(psVar30);
                      psVar30 = local_8918;
                      goto LAB_0014c601;
                    }
                  }
                  else {
                    if (uVar29 != 3) {
                      __assert_fail("tga_comp == STBI_rgb",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                                    ,0x1691,
                                    "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                   );
                    }
                    for (lVar32 = 0; uVar27 * 3 != (int)lVar32; lVar32 = lVar32 + 3) {
                      stbi__tga_read_rgb16(s,local_8918->huff_dc[0].fast + lVar32 + -8);
                    }
                  }
                }
                bVar63 = true;
                iVar19 = 0;
                uVar60 = 0;
                psVar45 = psVar30;
                for (uVar54 = 0; uVar54 != uVar52 * uVar59; uVar54 = uVar54 + 1) {
                  if (bVar16 < 8) {
LAB_0014c45d:
                    if (sVar14 == '\0') {
                      if (data._0_4_ == 0) {
                        for (uVar41 = 0; uVar39 != uVar41; uVar41 = uVar41 + 1) {
                          sVar15 = stbi__get8(s);
                          *(stbi_uc *)((long)coutput + uVar41) = sVar15;
                        }
                      }
                      else {
                        if (uVar29 != 3) {
                          __assert_fail("tga_comp == STBI_rgb",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                                        ,0x16c2,
                                        "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                       );
                        }
                        stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                      }
                    }
                    else {
                      if (bVar17 == 8) {
                        bVar12 = stbi__get8(s);
                        uVar61 = (uint)bVar12;
                      }
                      else {
                        uVar61 = stbi__get16le(s);
                      }
                      if (uVar27 <= uVar61) {
                        uVar61 = 0;
                      }
                      for (uVar41 = 0; uVar39 != uVar41; uVar41 = uVar41 + 1) {
                        *(stbi_uc *)((long)coutput + uVar41) =
                             local_8918->huff_dc[0].fast[uVar41 + uVar61 * uVar29 + -8];
                      }
                    }
                  }
                  else {
                    if (iVar19 == 0) {
                      bVar12 = stbi__get8(s);
                      iVar19 = (bVar12 & 0x7f) + 1;
                      uVar60 = (uint)(bVar12 >> 7);
                      goto LAB_0014c45d;
                    }
                    if (uVar60 == 0 || bVar63) {
                      uVar60 = (uint)(uVar60 != 0);
                      goto LAB_0014c45d;
                    }
                    uVar60 = 1;
                  }
                  for (uVar41 = 0; uVar39 != uVar41; uVar41 = uVar41 + 1) {
                    psVar45->huff_dc[0].fast[uVar41 - 8] = *(stbi_uc *)((long)coutput + uVar41);
                  }
                  iVar19 = iVar19 + -1;
                  psVar45 = (stbi__jpeg *)(psVar45->huff_dc[0].fast + (uVar39 - 8));
                  bVar63 = false;
                }
                if ((bVar18 >> 5 & 1) == 0) {
                  iVar19 = uVar29 * uVar59;
                  iVar26 = (uVar52 - 1) * iVar19;
                  uVar27 = 0;
                  for (uVar60 = 0; uVar60 != uVar52 + 1 >> 1; uVar60 = uVar60 + 1) {
                    psVar45 = psVar30;
                    for (iVar51 = iVar19; 0 < iVar51; iVar51 = iVar51 + -1) {
                      sVar14 = psVar45->huff_dc[0].fast[(ulong)uVar27 - 8];
                      psVar45->huff_dc[0].fast[(ulong)uVar27 - 8] =
                           psVar45->huff_dc[0].fast[(long)iVar26 + -8];
                      psVar45->huff_dc[0].fast[(long)iVar26 + -8] = sVar14;
                      psVar45 = (stbi__jpeg *)((long)&psVar45->s + 1);
                    }
                    uVar27 = uVar27 + iVar19;
                    iVar26 = iVar26 - iVar19;
                  }
                }
                free(local_8918);
              }
              if ((2 < uVar29) && (data._0_4_ == 0)) {
                iVar19 = uVar52 * uVar59;
                puVar42 = (undefined1 *)((long)&psVar30->s + 2);
                while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
                  uVar5 = puVar42[-2];
                  puVar42[-2] = *puVar42;
                  *puVar42 = uVar5;
                  puVar42 = puVar42 + uVar39;
                }
              }
              if (req_comp == 0) {
                return psVar30;
              }
              if (uVar29 == req_comp) {
                return psVar30;
              }
LAB_0014bd88:
              puVar34 = stbi__convert_format((uchar *)psVar30,uVar29,req_comp,uVar59,uVar52);
              return puVar34;
            }
LAB_0014c606:
            pcVar31 = "Corrupt TGA";
            goto LAB_0014917c;
          }
        }
        else {
LAB_0014a8e7:
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        pcVar31 = "Image not of any known type, or corrupt";
        goto LAB_0014917c;
      }
      psVar30 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (psVar30 == (stbi__jpeg *)0x0) {
        return (void *)0x0;
      }
      iVar19 = *x;
      iVar26 = *y;
      data_00 = (stbi__context *)stbi__malloc_mad3(iVar19,iVar26,req_comp,0);
      if (data_00 != (stbi__context *)0x0) {
        uVar54 = 0;
        uVar59 = (req_comp + (req_comp & 1U)) - 1;
        uVar52 = iVar26 * iVar19;
        uVar39 = (ulong)uVar59;
        if ((int)uVar59 < 1) {
          uVar39 = uVar54;
        }
        lVar32 = (long)req_comp;
        uVar41 = (ulong)uVar52;
        if ((int)uVar52 < 1) {
          uVar41 = uVar54;
        }
        psVar45 = psVar30;
        psVar49 = data_00;
        for (; uVar54 != uVar41; uVar54 = uVar54 + 1) {
          for (uVar53 = 0; uVar39 != uVar53; uVar53 = uVar53 + 1) {
            fVar64 = powf(*(float *)(psVar45->huff_dc[0].fast + uVar53 * 4 + -8) * stbi__h2l_scale_i
                          ,stbi__h2l_gamma_i);
            fVar65 = fVar64 * 255.0 + 0.5;
            fVar64 = 0.0;
            if (0.0 <= fVar65) {
              fVar64 = fVar65;
            }
            fVar65 = 255.0;
            if (fVar64 <= 255.0) {
              fVar65 = fVar64;
            }
            psVar49->buffer_start[uVar53 - 0x38] = (stbi_uc)(int)fVar65;
          }
          if ((int)uVar39 < req_comp) {
            lVar48 = uVar54 * lVar32 + uVar39;
            fVar65 = *(float *)(psVar30->huff_dc[0].fast + lVar48 * 4 + -8) * 255.0 + 0.5;
            fVar64 = 0.0;
            if (0.0 <= fVar65) {
              fVar64 = fVar65;
            }
            fVar65 = 255.0;
            if (fVar64 <= 255.0) {
              fVar65 = fVar64;
            }
            data_00->buffer_start[lVar48 + -0x38] = (stbi_uc)(int)fVar65;
          }
          psVar49 = (stbi__context *)(psVar49->buffer_start + lVar32 + -0x38);
          psVar45 = (stbi__jpeg *)(psVar45->huff_dc[0].fast + lVar32 * 4 + -8);
        }
        goto LAB_00149e71;
      }
LAB_0014ab82:
      free(psVar30);
    }
  }
LAB_0014ab87:
  pcVar31 = "Out of memory";
LAB_0014917c:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}